

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmSccEa<(moira::Instr)116,(moira::Mode)4,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  undefined1 local_38 [8];
  Ea<(moira::Mode)4,_1> src;
  u16 op_local;
  u32 *addr_local;
  StrWriter *str_local;
  Moira *this_local;
  
  src.ext2._2_2_ = op;
  unique0x10000086 = addr;
  Op<(moira::Mode)4,1>((Ea<(moira::Mode)4,_1> *)local_38,this,op & 7,addr);
  pSVar1 = StrWriter::operator<<(str);
  pSVar1 = StrWriter::operator<<(pSVar1,(Tab)(str->tab).raw);
  StrWriter::operator<<(pSVar1,(Ea<(moira::Mode)4,_1> *)local_38);
  return;
}

Assistant:

void
Moira::dasmSccEa(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << str.tab << src;
}